

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# person_debt.cpp
# Opt level: O0

void debts::showDebt(Debt *rd)

{
  ostream *this;
  void *this_00;
  Debt *rd_local;
  
  pers::showPerson(&rd->name);
  this = std::operator<<((ostream *)&std::cout,": $");
  this_00 = (void *)std::ostream::operator<<(this,rd->amount);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void showDebt(const Debt & rd) {
        showPerson(rd.name);
        std::cout << ": $" << rd.amount << std::endl;
    }